

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketOnline.cpp
# Opt level: O1

void __thiscall SocketOnline::send_message(SocketOnline *this,Mat *a)

{
  int __fd;
  int u;
  int iVar1;
  ssize_t sVar2;
  char *__buf;
  
  u = Mat::toString_pos(a,this->buffer);
  Constant::Util::int_to_header(this->header,u);
  __fd = this->sock;
  __buf = this->header;
  iVar1 = 0;
  do {
    sVar2 = write(__fd,__buf,(long)(4 - iVar1));
    __buf = __buf + (int)sVar2;
    iVar1 = (int)sVar2 + iVar1;
  } while (iVar1 < 4);
  this->send_num = this->send_num + 4;
  send_message_n(this,this->sock,this->buffer,u);
  return;
}

Assistant:

void SocketOnline::send_message(const Mat &a) {
    int len_buffer;
    len_buffer = a.toString_pos(buffer);
    Constant::Util::int_to_header(header, len_buffer);
    send_message_n(sock, header, HEADER_LEN);
    send_message_n(sock, buffer, len_buffer);
}